

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::ToTokenProperty<tinyusdz::GeomMesh::SubdivisionScheme>
               (TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *input,
               Property *output,string *err)

{
  bool *this;
  bool bVar1;
  Variability *pVVar2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  SubdivisionScheme *v_00;
  AttrMeta *pAVar3;
  AttrMeta *this_00;
  SubdivisionScheme v_01;
  Property local_9b0;
  int local_3cc;
  undefined1 local_3c8 [8];
  Value val;
  undefined1 local_390 [8];
  token tok;
  undefined1 local_368 [4];
  SubdivisionScheme a;
  PrimVar pvar;
  Animatable<tinyusdz::GeomMesh::SubdivisionScheme> *v;
  string local_2f0;
  undefined1 local_2d0 [8];
  Attribute attr;
  string *err_local;
  Property *output_local;
  TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *input_local;
  
  attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  Attribute::Attribute((Attribute *)local_2d0);
  pVVar2 = Attribute::variability((Attribute *)local_2d0);
  *pVVar2 = Uniform;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2f0,"token",(allocator *)((long)&v + 7));
  Attribute::set_type_name((Attribute *)local_2d0,&local_2f0);
  ::std::__cxx11::string::~string((string *)&local_2f0);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&v + 7));
  bVar1 = TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::is_blocked(input);
  if (bVar1) {
    bVar1 = TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::is_blocked(input);
    Attribute::set_blocked((Attribute *)local_2d0,bVar1);
  }
  bVar1 = TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::has_connections(input);
  if (bVar1) {
    paths = TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::get_connections
                      (input);
    Attribute::set_connections((Attribute *)local_2d0,paths);
  }
  v_00 = TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::get_value(input);
  Animatable<tinyusdz::GeomMesh::SubdivisionScheme>::Animatable
            ((Animatable<tinyusdz::GeomMesh::SubdivisionScheme> *)&pvar._ts._dirty,v_00);
  this = &pvar._ts._dirty;
  primvar::PrimVar::PrimVar((PrimVar *)local_368);
  bVar1 = Animatable<tinyusdz::GeomMesh::SubdivisionScheme>::has_default
                    ((Animatable<tinyusdz::GeomMesh::SubdivisionScheme> *)this);
  if (bVar1) {
    bVar1 = Animatable<tinyusdz::GeomMesh::SubdivisionScheme>::get_scalar
                      ((Animatable<tinyusdz::GeomMesh::SubdivisionScheme> *)this,
                       (SubdivisionScheme *)(tok.str_.field_2._M_local_buf + 0xc));
    if (!bVar1) {
      if (attr._metas.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::__cxx11::string::operator+=
                  ((string *)
                   attr._metas.stringData.
                   super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "[InternalError] Invalid value.");
      }
      input_local._7_1_ = 0;
      local_3cc = 1;
      goto LAB_004b165c;
    }
    tinyusdz::to_string_abi_cxx11_
              ((string *)&val.v_.vtable,(tinyusdz *)(ulong)(uint)tok.str_.field_2._12_4_,v_01);
    Token::Token((Token *)local_390,(string *)&val.v_.vtable);
    ::std::__cxx11::string::~string((string *)&val.v_.vtable);
    tinyusdz::value::Value::Value<tinyusdz::Token>((Value *)local_3c8,(Token *)local_390);
    primvar::PrimVar::set_value<tinyusdz::value::Value>((PrimVar *)local_368,(Value *)local_3c8);
    tinyusdz::value::Value::~Value((Value *)local_3c8);
    Token::~Token((Token *)local_390);
    Attribute::set_var((Attribute *)local_2d0,(PrimVar *)local_368);
  }
  local_3cc = 0;
LAB_004b165c:
  primvar::PrimVar::~PrimVar((PrimVar *)local_368);
  Animatable<tinyusdz::GeomMesh::SubdivisionScheme>::~Animatable
            ((Animatable<tinyusdz::GeomMesh::SubdivisionScheme> *)&pvar._ts._dirty);
  if (local_3cc == 0) {
    pAVar3 = TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::metas(input);
    this_00 = Attribute::metas((Attribute *)local_2d0);
    AttrMetas::operator=(this_00,pAVar3);
    Property::Property(&local_9b0,(Attribute *)local_2d0,false);
    Property::operator=(output,&local_9b0);
    Property::~Property(&local_9b0);
    input_local._7_1_ = 1;
    local_3cc = 1;
  }
  Attribute::~Attribute((Attribute *)local_2d0);
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

bool ToTokenProperty(const TypedAttributeWithFallback<T> &input,
                     Property &output, std::string *err) {
#if 0
  if (input.is_blocked()) {
    Attribute attr;
    attr.set_blocked(input.is_blocked());
    attr.variability() = Variability::Uniform;
    attr.set_type_name(value::kToken);
    output = Property(std::move(attr), /*custom*/ false);
  } else if (input.is_value_empty()) {
    // type info only
    Property p;
    p.set_property_type(Property::Type::EmptyAttrib);
    p.attribute().set_type_name(value::kToken);
    p.set_custom(false);
    output = p;
  } else if (input.is_connection()) {
    // Use Relation for Connection(as typed relationshipTarget)
    // Single connection targetPath only.
    Relationship rel;
    std::vector<Path> pv = input.get_connections();
    if (pv.empty()) {
      DCOUT("??? Empty connectionTarget.");
      if (err) {
        (*err) += "Empty connectionTarget.";
      }
      return false;
    }
    if (pv.size() == 1) {
      output = Property(pv[0], /* type */ value::kToken, /* custom */ false);
    } else if (pv.size() > 1) {
      output = Property(pv, /* type */ value::kToken, /* custom */ false);
    } else {
      if (err) {
        (*err) += "[InternalError] Get connectionTarget failed.";
      }
      return false;
    }

  } else {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;

    if (v.is_scalar()) {
      T a;
      if (v.get_scalar(&a)) {
        // to token type
        value::token tok(to_string(a));
        value::Value val(tok);
        pvar.set_value(val);
      } else {
        if (err) {
          (*err) += "[InternalError] Invalid value.";
        }
        return false;
      }
    } else {
      if (err) {
        (*err) += "[InternalError] Invalid value.";
      }
      return false;
    }

    Attribute attr;
    attr.set_var(std::move(pvar));
    attr.variability() = Variability::Uniform;
    output = Property(attr, /* custom */ false);
  }
#endif

  Attribute attr;
  attr.variability() = Variability::Uniform;
  attr.set_type_name(value::kToken);

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    attr.set_connections(input.get_connections());
  }

  {
    // Includes !authored()
    // FIXME: Currently scalar only.
    const Animatable<T> &v = input.get_value();

    primvar::PrimVar pvar;

    if (v.has_default()) {
      T a;
      if (v.get_scalar(&a)) {
        // to token type
        value::token tok(to_string(a));
        value::Value val(tok);
        pvar.set_value(val);
      } else {
        if (err) {
          (*err) += "[InternalError] Invalid value.";
        }
        return false;
      }

      attr.set_var(std::move(pvar));
    }

  }

  attr.metas() = input.metas();
  output = Property(attr, /* custom */ false);

  return true;
}